

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

double __thiscall arangodb::velocypack::Parser::scanDigitsFractional(Parser *this)

{
  int iVar1;
  Parser *in_RDI;
  int i;
  double x;
  double pot;
  double local_20;
  double local_18;
  
  local_18 = 0.1;
  local_20 = 0.0;
  while( true ) {
    iVar1 = consume(in_RDI);
    if (iVar1 < 0) {
      return local_20;
    }
    if ((iVar1 < 0x30) || (0x39 < iVar1)) break;
    local_20 = local_18 * (double)(iVar1 + -0x30) + local_20;
    local_18 = local_18 / 10.0;
  }
  unconsume(in_RDI);
  return local_20;
}

Assistant:

double scanDigitsFractional() {
    double pot = 0.1;
    double x = 0.0;
    while (true) {
      int i = consume();
      if (i < 0) {
        return x;
      }
      if (i < '0' || i > '9') {
        unconsume();
        return x;
      }
      x = x + pot * (i - '0');
      pot /= 10.0;
    }
  }